

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)> *
nonius::detail::
measure<std::chrono::_V2::system_clock,std::vector<double,std::allocator<double>>(*&)(int),int&>
          (_func_vector<double,_std::allocator<double>_>_int **fun,int *args)

{
  type this;
  TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)> *in_RDI;
  type delta;
  time_point end;
  CompleteType<ResultOf<vector<double,_allocator<double>_>_(*&(int_&))(int)>_> *r;
  time_point start;
  TimingOf<std::chrono::_V2::system_clock,_std::vector<double>_(*&(int_&))(int)> *__lhs;
  vector<double,_std::allocator<double>_> *result;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> *local_28;
  undefined8 local_20;
  
  __lhs = in_RDI;
  local_20 = std::chrono::_V2::system_clock::now();
  result = &local_40;
  complete_invoke<std::vector<double,std::allocator<double>>(*&)(int),int&>
            ((_func_vector<double,_std::allocator<double>_>_int **)__lhs,(int *)in_RDI);
  local_28 = result;
  std::chrono::_V2::system_clock::now();
  this = std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)__lhs,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_RDI);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_RDI,
             (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff80);
  timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
  ::timing((timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
            *)this.__r,in_stack_ffffffffffffff80,result,(int)((ulong)__lhs >> 0x20));
  std::vector<double,_std::allocator<double>_>::~vector(result);
  std::vector<double,_std::allocator<double>_>::~vector(result);
  return __lhs;
}

Assistant:

TimingOf<Clock, Fun(Args...)> measure(Fun&& fun, Args&&... args) {
            auto start = Clock::now();
            auto&& r = detail::complete_invoke(fun, std::forward<Args>(args)...);
            auto end = Clock::now();
            auto delta = end - start;
            return { delta, std::forward<decltype(r)>(r), 1 };
        }